

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O3

double orient3d(double *pa,double *pb,double *pc,double *pd)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  byte bVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  int flen;
  uint uVar23;
  double *pdVar24;
  double *pdVar25;
  double *pdVar26;
  double *pdVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  undefined4 uVar46;
  double b;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dStack_1270;
  double dStack_1240;
  double dStack_1230;
  double dStack_1220;
  double dStack_1200;
  double dStack_11d0;
  double dStack_11c0;
  double dStack_11b0;
  double dStack_11a0;
  double dStack_1178;
  double dStack_1170;
  double dStack_1168;
  double dStack_1160;
  double dStack_1158;
  double dStack_1150;
  undefined1 auStack_1148 [16];
  double dStack_1138;
  double dStack_1130;
  undefined1 auStack_1128 [16];
  double dStack_1118;
  double dStack_1110;
  double dStack_1108;
  double dStack_1100;
  double dStack_10f8;
  double dStack_10f0;
  undefined1 auStack_10e8 [16];
  double dStack_10d8;
  double dStack_10d0;
  double dStack_10c8;
  double dStack_10c0;
  double dStack_10b8;
  double dStack_10b0;
  undefined1 auStack_10a8 [16];
  undefined1 auStack_1098 [16];
  undefined1 auStack_1088 [16];
  undefined1 auStack_1078 [16];
  undefined1 auStack_1068 [16];
  double dStack_1058;
  double dStack_1050;
  undefined1 auStack_1048 [16];
  undefined1 auStack_1038 [16];
  undefined1 auStack_1028 [16];
  double dStack_1018;
  undefined8 uStack_1010;
  undefined1 auStack_1008 [16];
  undefined1 auStack_ff8 [16];
  double dStack_fe8;
  undefined8 uStack_fe0;
  undefined1 auStack_fd8 [16];
  undefined1 auStack_fc8 [16];
  undefined1 auStack_fb8 [16];
  double dStack_fa8;
  undefined8 uStack_fa0;
  undefined1 auStack_f98 [16];
  undefined1 auStack_f88 [16];
  undefined1 auStack_f78 [16];
  double dStack_f68;
  double dStack_f60;
  undefined1 auStack_f58 [16];
  double dStack_f48;
  double dStack_f40;
  undefined1 auStack_f38 [16];
  double dStack_f28;
  double dStack_f20;
  double adStack_f18 [16];
  double adStack_e98 [12];
  double adStack_e38 [8];
  double adStack_df8 [8];
  double adStack_db8 [8];
  double adStack_d78 [8];
  double adStack_d38 [8];
  double adStack_cf8 [8];
  double adStack_cb8 [16];
  double adStack_c38 [192];
  double adStack_638 [193];
  
  dVar51 = splitter;
  auStack_1078._8_8_ = auStack_1078._0_8_;
  auStack_10e8._8_8_ = auStack_10e8._0_8_;
  auStack_1038._8_8_ = auStack_1038._0_8_;
  dVar1 = pd[2];
  dVar33 = *pd;
  dVar36 = pd[1];
  dVar49 = (pb[1] - dVar36) * (*pc - dVar33);
  dVar52 = (*pb - dVar33) * (pc[1] - dVar36);
  dVar48 = (pb[1] - dVar36) * (*pa - dVar33);
  dVar35 = (*pb - dVar33) * (pa[1] - dVar36);
  dVar29 = (pa[1] - dVar36) * (*pc - dVar33);
  dVar33 = (*pa - dVar33) * (pc[1] - dVar36);
  dVar36 = (dVar48 - dVar35) * (pc[2] - dVar1) +
           (dVar52 - dVar49) * (pa[2] - dVar1) + (dVar29 - dVar33) * (pb[2] - dVar1);
  if ((_use_inexact_arith != 0) ||
     ((_use_static_filter != 0 && ((o3dstaticfilter < dVar36 || (dVar36 < -o3dstaticfilter)))))) {
    return dVar36;
  }
  dStack_1138 = ABS(pc[2] - dVar1) * (ABS(dVar35) + ABS(dVar48)) +
                ABS(pa[2] - dVar1) * (ABS(dVar52) + ABS(dVar49)) +
                ABS(pb[2] - dVar1) * (ABS(dVar33) + ABS(dVar29));
  if (o3derrboundA * dStack_1138 < dVar36) {
    return dVar36;
  }
  if (o3derrboundA * dStack_1138 < -dVar36) {
    return dVar36;
  }
  dVar1 = *pa;
  dStack_fa8 = pb[1];
  dVar48 = *pb;
  dVar35 = *pc;
  auStack_fb8 = *(undefined1 (*) [16])pd;
  dVar28 = auStack_fb8._0_8_;
  auVar2._8_4_ = SUB84(dVar35,0);
  auVar2._0_8_ = dVar48;
  auVar2._12_4_ = (int)((ulong)dVar35 >> 0x20);
  auStack_fc8._8_4_ = auStack_fb8._0_4_;
  auStack_fc8._0_8_ = dVar28;
  auStack_fc8._12_4_ = auStack_fb8._4_4_;
  dVar36 = dVar48 - dVar28;
  dVar35 = dVar35 - dVar28;
  uVar46 = (undefined4)((ulong)dVar35 >> 0x20);
  uStack_fa0 = 0;
  dVar28 = dVar1 - dVar28;
  dVar29 = auStack_fb8._8_8_;
  dVar37 = dStack_fa8 - dVar29;
  dVar49 = pc[1];
  dVar52 = pa[1];
  auVar3._8_4_ = SUB84(dVar52,0);
  auVar3._0_8_ = dVar49;
  auVar3._12_4_ = (int)((ulong)dVar52 >> 0x20);
  auStack_fd8._8_4_ = auStack_fb8._8_4_;
  auStack_fd8._0_8_ = dVar29;
  auStack_fd8._12_4_ = auStack_fb8._12_4_;
  dVar34 = dVar49 - dVar29;
  auVar4._8_4_ = SUB84(dVar52 - dVar29,0);
  auVar4._0_8_ = dVar34;
  auVar4._12_4_ = (int)((ulong)(dVar52 - dVar29) >> 0x20);
  dStack_1018 = splitter;
  uStack_1010 = 0;
  auVar5._8_4_ = SUB84(splitter,0);
  auVar5._0_8_ = splitter;
  auVar5._12_4_ = (int)((ulong)splitter >> 0x20);
  dVar39 = dVar35 * splitter - (dVar35 * splitter - dVar35);
  dVar44 = dVar34 * splitter - (dVar34 * splitter - dVar34);
  dVar43 = dVar37 * splitter - (dVar37 * splitter - dVar37);
  dVar38 = dVar36 * splitter - (dVar36 * splitter - dVar36);
  uVar20 = (uint)((ulong)dVar38 >> 0x20);
  dVar29 = dVar36 * dVar34;
  auVar11._8_4_ = SUB84(dVar35,0);
  auVar11._0_8_ = dVar36;
  auVar11._12_4_ = uVar46;
  auStack_1008._8_4_ = SUB84(dVar35,0);
  auStack_1008._0_8_ = dVar34;
  auStack_1008._12_4_ = uVar46;
  dVar50 = dVar28 * dVar34;
  dVar33 = dVar37 * dVar35;
  auVar8._8_4_ = SUB84(dVar38,0);
  auVar8._0_8_ = dVar43;
  auVar8._12_4_ = uVar20;
  auStack_1128._8_4_ = SUB84(dVar44,0);
  auStack_1128._0_8_ = dVar39;
  auStack_1128._12_4_ = (int)((ulong)dVar44 >> 0x20);
  dStack_1118 = dVar35 - dVar39;
  dStack_1110 = dVar34 - dVar44;
  dVar52 = dVar37 - dVar43;
  dVar47 = dVar36 - dVar38;
  auStack_1088._8_4_ = SUB84(dVar47,0);
  auStack_1088._0_8_ = dVar52;
  auStack_1088._12_4_ = (int)((ulong)dVar47 >> 0x20);
  dVar32 = dVar52 * dStack_1118 -
           (((dVar33 - dVar39 * dVar43) - dStack_1118 * dVar43) - dVar52 * dVar39);
  dVar44 = dVar47 * dStack_1110 -
           (((dVar29 - dVar38 * dVar44) - dVar47 * dVar44) - dStack_1110 * dVar38);
  dVar10 = dVar44 - dVar32;
  dVar40 = dVar29 + dVar10;
  dVar30 = (dVar29 - (dVar40 - (dVar40 - dVar29))) + (dVar10 - (dVar40 - dVar29));
  auVar12._8_4_ = SUB84(dVar33,0);
  auVar12._0_8_ = dVar50;
  auVar12._12_4_ = (int)((ulong)dVar33 >> 0x20);
  dVar31 = dVar30 - dVar33;
  dVar52 = pa[2];
  dVar29 = pb[2];
  dVar30 = (dVar30 - (dVar31 + (dVar30 - dVar31))) + ((dVar30 - dVar31) - dVar33);
  dStack_fe8 = pd[2];
  dVar33 = pc[2];
  auStack_f38._8_4_ = SUB84(dVar30,0);
  auStack_f38._0_8_ = (dVar44 - (dVar10 + (dVar44 - dVar10))) + ((dVar44 - dVar10) - dVar32);
  auStack_f38._12_4_ = (int)((ulong)dVar30 >> 0x20);
  dStack_f20 = dVar40 + dVar31;
  dStack_f28 = (dVar40 - (dStack_f20 - (dStack_f20 - dVar40))) + (dVar31 - (dStack_f20 - dVar40));
  dVar10 = dVar33 - dStack_fe8;
  uStack_fe0 = 0;
  auStack_ff8._8_4_ = SUB84(dStack_fe8,0);
  auStack_ff8._0_8_ = dStack_fe8;
  auStack_ff8._12_4_ = (int)((ulong)dStack_fe8 >> 0x20);
  dVar31 = dVar52 - dStack_fe8;
  b = dVar29 - dStack_fe8;
  dVar39 = -dVar39;
  auVar6._8_4_ = SUB84(dVar38,0);
  auVar6._0_8_ = dVar39;
  auVar6._12_4_ = uVar20 ^ 0x80000000;
  dVar40 = -dStack_1118;
  iVar17 = scale_expansion_zeroelim(4,(double *)auStack_f38,dVar31,adStack_d78);
  dStack_11d0 = auVar4._8_8_;
  dStack_1158 = dStack_11d0;
  dStack_1150 = dStack_11d0;
  dVar32 = dVar35 * dStack_11d0;
  dStack_1270 = auVar5._8_8_;
  dVar41 = dVar51 * dStack_11d0 - (dVar51 * dStack_11d0 - dStack_11d0);
  dVar44 = dStack_1270 * dVar28 - (dStack_1270 * dVar28 - dVar28);
  dVar38 = dStack_11d0 - dVar41;
  dVar30 = dVar28 - dVar44;
  dVar51 = -dVar44;
  auStack_1098._8_4_ = SUB84(dVar44,0);
  auStack_1098._0_8_ = dVar51;
  auStack_1098._12_4_ = (uint)((ulong)dVar44 >> 0x20) ^ 0x80000000;
  auStack_1148._8_8_ = -dVar30;
  auStack_1148._0_8_ = -dVar30;
  auStack_f98._8_4_ = SUB84(dVar30,0);
  auStack_f98._0_8_ = dVar38;
  auStack_f98._12_4_ = (int)((ulong)dVar30 >> 0x20);
  dVar42 = dStack_1118 * dVar38 - (dVar38 * dVar39 + dVar41 * dVar40 + dVar32 + dVar41 * dVar39);
  dVar45 = dStack_1110 * dVar30 -
           (dVar51 * dStack_1110 +
           -dVar30 * (double)auStack_1128._8_8_ + dVar50 + dVar51 * (double)auStack_1128._8_8_);
  dVar44 = dVar42 - dVar45;
  dVar40 = dVar32 + dVar44;
  dVar51 = (dVar32 - (dVar40 - (dVar40 - dVar32))) + (dVar44 - (dVar40 - dVar32));
  dVar39 = dVar51 - dVar50;
  dVar51 = (dVar51 - ((dVar51 - dVar39) + dVar39)) + ((dVar51 - dVar39) - dVar50);
  auStack_f58._8_4_ = SUB84(dVar51,0);
  auStack_f58._0_8_ = (dVar42 - (dVar44 + (dVar42 - dVar44))) + ((dVar42 - dVar44) - dVar45);
  auStack_f58._12_4_ = (int)((ulong)dVar51 >> 0x20);
  dStack_f40 = dVar40 + dVar39;
  dStack_f48 = (dVar40 - (dStack_f40 - (dStack_f40 - dVar40))) + (dVar39 - (dStack_f40 - dVar40));
  auStack_f88._8_4_ = SUB84(dVar38,0);
  auStack_f88._0_8_ = dVar30;
  auStack_f88._12_4_ = (int)((ulong)dVar38 >> 0x20);
  auStack_10a8._8_4_ = SUB84(b,0);
  auStack_10a8._0_8_ = b;
  auStack_10a8._12_4_ = (int)((ulong)b >> 0x20);
  iVar18 = scale_expansion_zeroelim(4,(double *)auStack_f58,b,adStack_cf8);
  dVar39 = dVar37 * dVar28;
  dVar38 = dStack_11d0 * dVar36;
  dStack_1240 = auVar6._8_8_;
  dVar30 = (double)auStack_f88._0_8_ * (double)auStack_1088._0_8_ -
           ((double)auStack_1088._0_8_ * (double)auStack_1098._0_8_ +
           (double)auStack_1148._0_8_ * dVar43 + (double)auStack_1098._0_8_ * dVar43 + dVar39);
  dVar47 = (double)auStack_f88._8_8_ * (double)auStack_1088._8_8_ -
           ((double)auStack_f98._0_8_ * dStack_1240 +
           -dVar47 * dVar41 + dStack_1240 * dVar41 + dVar38);
  dVar44 = dVar30 - dVar47;
  dVar51 = dVar39 + dVar44;
  dVar39 = (dVar39 - (dVar51 - (dVar51 - dVar39))) + (dVar44 - (dVar51 - dVar39));
  dVar32 = dVar39 - dVar38;
  dVar39 = (dVar39 - ((dVar39 - dVar32) + dVar32)) + ((dVar39 - dVar32) - dVar38);
  auStack_f78._8_4_ = SUB84(dVar39,0);
  auStack_f78._0_8_ = (dVar30 - (dVar44 + (dVar30 - dVar44))) + ((dVar30 - dVar44) - dVar47);
  auStack_f78._12_4_ = (int)((ulong)dVar39 >> 0x20);
  dStack_f60 = dVar51 + dVar32;
  dStack_f68 = (dVar51 - (dStack_f60 - (dStack_f60 - dVar51))) + (dVar32 - (dStack_f60 - dVar51));
  pdVar24 = adStack_d38;
  iVar19 = scale_expansion_zeroelim(4,(double *)auStack_f78,dVar10,pdVar24);
  iVar17 = fast_expansion_sum_zeroelim(iVar17,adStack_d78,iVar18,adStack_cf8,adStack_cb8);
  pdVar25 = adStack_c38;
  uVar20 = fast_expansion_sum_zeroelim(iVar17,adStack_cb8,iVar19,pdVar24,pdVar25);
  if (1 < (int)uVar20) {
    pdVar24 = (double *)0x1;
    do {
      adStack_c38[0] = adStack_c38[0] + adStack_c38[(long)pdVar24];
      pdVar24 = (double *)((long)pdVar24 + 1);
    } while ((double *)(ulong)uVar20 != pdVar24);
  }
  dStack_1220 = auVar2._8_8_;
  dStack_1200 = auVar3._8_8_;
  if (o3derrboundB * dStack_1138 <= adStack_c38[0]) {
    return adStack_c38[0];
  }
  if (o3derrboundB * dStack_1138 <= -adStack_c38[0]) {
    return adStack_c38[0];
  }
  dVar1 = (dVar1 - (dVar28 + (dVar1 - dVar28))) + ((dVar1 - dVar28) - (double)auStack_fb8._0_8_);
  dStack_11c0 = auVar11._8_8_;
  dVar51 = (dVar48 - (dVar36 + (dVar48 - dVar36))) + ((dVar48 - dVar36) - (double)auStack_fc8._0_8_)
  ;
  dVar39 = (dStack_1220 - (dStack_11c0 + (dStack_1220 - dStack_11c0))) +
           ((dStack_1220 - dStack_11c0) - (double)auStack_fc8._8_8_);
  dVar32 = (dVar49 - (dVar34 + (dVar49 - dVar34))) + ((dVar49 - dVar34) - (double)auStack_fd8._0_8_)
  ;
  dVar44 = (dStack_1200 - (dStack_11d0 + (dStack_1200 - dStack_11d0))) +
           ((dStack_1200 - dStack_11d0) - (double)auStack_fd8._8_8_);
  dVar48 = (dVar52 - (dVar31 + (dVar52 - dVar31))) + ((dVar52 - dVar31) - (double)auStack_ff8._0_8_)
  ;
  dVar49 = (dVar29 - (b + (dVar29 - b))) + ((dVar29 - b) - (double)auStack_ff8._8_8_);
  dVar52 = (dVar33 - (dVar10 + (dVar33 - dVar10))) + ((dVar33 - dVar10) - dStack_fe8);
  dVar29 = (dStack_fa8 - (dVar37 + (dStack_fa8 - dVar37))) +
           ((dStack_fa8 - dVar37) - (double)auStack_fb8._8_8_);
  auVar7._8_4_ = (int)-(ulong)(dVar29 == 0.0);
  auVar7._0_8_ = -(ulong)(dVar52 == 0.0);
  auVar7._12_4_ = (int)(-(ulong)(dVar29 == 0.0) >> 0x20);
  uVar23 = movmskpd((int)pdVar24,auVar7);
  bVar16 = (byte)uVar23 >> 1;
  if (((((dVar1 == 0.0) && (!NAN(dVar1))) && (dVar51 == 0.0)) && ((!NAN(dVar51) && (dVar39 == 0.0)))
      ) && ((((!NAN(dVar39) && ((dVar44 == 0.0 && (!NAN(dVar44))))) && (bVar16 != 0)) &&
            ((((dVar32 == 0.0 && (!NAN(dVar32))) && (dVar48 == 0.0)) &&
             (((!NAN(dVar48) && (dVar49 == 0.0)) && ((!NAN(dVar49) && ((uVar23 & 1) != 0)))))))))) {
    return adStack_c38[0];
  }
  dVar41 = dStack_1138 * o3derrboundC + ABS(adStack_c38[0]) * resulterrbound;
  dVar33 = dVar51 * dVar34;
  dVar30 = dVar39 * dStack_11d0;
  dStack_1138 = dVar29 * dStack_11c0;
  dStack_1130 = dVar32 * dVar28;
  auVar9._8_4_ = SUB84(dVar30,0);
  auVar9._0_8_ = dVar33;
  auVar9._12_4_ = (int)((ulong)dVar30 >> 0x20);
  dStack_11a0 = auVar12._8_8_;
  dVar47 = dVar1 * dVar37;
  dVar40 = dVar36 * dVar44;
  adStack_c38[0] =
       ((dVar28 * dVar29 + dVar47) - (dStack_1158 * dVar51 + dVar40)) * dVar10 +
       (dVar28 * dVar37 - dVar38) * dVar52 +
       ((dStack_11c0 * dVar44 + dVar30) - (dVar1 * dVar34 + dStack_1130)) * b +
       (dStack_11d0 * (double)auStack_1008._8_8_ - dVar50) * dVar49 +
       ((dVar36 * dVar32 + dVar33) - (dVar39 * dVar37 + dStack_1138)) * dVar31 +
       (dVar36 * (double)auStack_1008._0_8_ - dStack_11a0) * dVar48 + adStack_c38[0];
  if (dVar41 <= adStack_c38[0]) {
    return adStack_c38[0];
  }
  if (dVar41 <= -adStack_c38[0]) {
    return adStack_c38[0];
  }
  dStack_11b0 = auVar8._8_8_;
  dStack_1230 = auVar9._8_8_;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    auStack_1148._8_4_ = SUB84(dVar37,0);
    auStack_1148._0_8_ = dVar37;
    auStack_1148._12_4_ = (int)((ulong)dVar37 >> 0x20);
    dVar38 = dVar1 * dStack_1018 - (dVar1 * dStack_1018 - dVar1);
    auStack_1098._0_8_ = dVar1 - dVar38;
    auStack_1098._8_8_ = 0;
    dStack_10c8 = (double)auStack_1098._0_8_ * (double)auStack_1088._0_8_ -
                  (((dVar47 - dVar38 * dVar43) - (double)auStack_1098._0_8_ * dVar43) -
                  dVar38 * (double)auStack_1088._0_8_);
    if ((dVar44 != 0.0) || (NAN(dVar44))) {
      dVar41 = dStack_1018 * dVar44 - (dStack_1018 * dVar44 - dVar44);
      dVar43 = dVar44 - dVar41;
      dVar50 = (double)auStack_1088._8_8_ * dVar43 -
               (((dVar40 - dVar41 * dStack_11b0) - dStack_11b0 * dVar43) -
               dVar41 * (double)auStack_1088._8_8_);
      dVar45 = dStack_10c8 - dVar50;
      dVar42 = dVar47 + dVar45;
      dVar30 = (dVar47 - (dVar42 - (dVar42 - dVar47))) + (dVar45 - (dVar42 - dVar47));
      dVar47 = dVar30 - dVar40;
      dStack_10c8 = (dStack_10c8 - (dVar45 + (dStack_10c8 - dVar45))) +
                    ((dStack_10c8 - dVar45) - dVar50);
      dStack_10c0 = (dVar30 - ((dVar30 - dVar47) + dVar47)) + ((dVar30 - dVar47) - dVar40);
      dStack_10b0 = dVar42 + dVar47;
      dStack_10b8 = (dVar42 - (dStack_10b0 - (dStack_10b0 - dVar42))) +
                    (dVar47 - (dStack_10b0 - dVar42));
      dStack_11c0 = dVar44 * dStack_11c0;
      dVar47 = dVar34 * dVar1;
      dVar43 = dVar43 * dStack_1118 -
               (-dVar41 * dStack_1118 +
               -dVar43 * (double)auStack_1128._0_8_ +
               -dVar41 * (double)auStack_1128._0_8_ + dStack_11c0);
      dVar38 = (double)auStack_1098._0_8_ * dStack_1110 -
               (-dVar38 * dStack_1110 +
               -(double)auStack_1098._0_8_ * (double)auStack_1128._8_8_ +
               -dVar38 * (double)auStack_1128._8_8_ + dVar47);
      dVar41 = dVar43 - dVar38;
      dVar30 = dStack_11c0 + dVar41;
      dVar50 = (dStack_11c0 - (dVar30 - (dVar30 - dStack_11c0))) + (dVar41 - (dVar30 - dStack_11c0))
      ;
      dVar40 = dVar50 - dVar47;
      dVar47 = (dVar50 - (dVar40 + (dVar50 - dVar40))) + ((dVar50 - dVar40) - dVar47);
      auStack_1038._8_4_ = SUB84(dVar47,0);
      auStack_1038._0_8_ = (dVar43 - (dVar41 + (dVar43 - dVar41))) + ((dVar43 - dVar41) - dVar38);
      auStack_1038._12_4_ = (int)((ulong)dVar47 >> 0x20);
      dVar43 = dVar30 + dVar40;
      auStack_1028._8_4_ = SUB84(dVar43,0);
      auStack_1028._0_8_ = (dVar30 - (dVar43 - (dVar43 - dVar30))) + (dVar40 - (dVar43 - dVar30));
      auStack_1028._12_4_ = (int)((ulong)dVar43 >> 0x20);
      iVar17 = 4;
    }
    else {
      dVar43 = -dVar1;
      dVar38 = dStack_1018 * dVar43 - (dVar1 + dStack_1018 * dVar43);
      auStack_1038._8_8_ = dVar34 * dVar43;
      auStack_1038._0_8_ =
           dStack_1110 * (dVar43 - dVar38) -
           (((dVar34 * dVar43 - dVar38 * (double)auStack_1128._8_8_) -
            (double)auStack_1128._8_8_ * (dVar43 - dVar38)) - dVar38 * dStack_1110);
      iVar17 = 2;
      dStack_10c0 = dVar47;
    }
  }
  else if ((dVar44 != 0.0) || (NAN(dVar44))) {
    dVar43 = -dVar44;
    dStack_10c0 = dVar36 * dVar43;
    dVar38 = dStack_1018 * dVar43 - (dVar44 + dStack_1018 * dVar43);
    dStack_10c8 = (double)auStack_1088._8_8_ * (dVar43 - dVar38) -
                  (((dStack_10c0 - dVar38 * dStack_11b0) - dStack_11b0 * (dVar43 - dVar38)) -
                  dVar38 * (double)auStack_1088._8_8_);
    dVar43 = dStack_1018 * dVar44 - (dStack_1018 * dVar44 - dVar44);
    auStack_1038._8_8_ = dVar35 * dVar44;
    auStack_1038._0_8_ =
         (dVar44 - dVar43) * dStack_1118 -
         (((dVar35 * dVar44 - dVar43 * (double)auStack_1128._0_8_) -
          (double)auStack_1128._0_8_ * (dVar44 - dVar43)) - dVar43 * dStack_1118);
    iVar17 = 2;
  }
  else {
    dStack_10c8 = 0.0;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = auStack_1038._8_8_;
    auStack_1038 = auVar13 << 0x40;
    iVar17 = 1;
  }
  if ((dVar51 != 0.0) || (NAN(dVar51))) {
    dVar30 = dVar51 * splitter - (dVar51 * splitter - dVar51);
    dVar43 = dVar51 - dVar30;
    dVar38 = dVar34 * splitter - (dVar34 * splitter - dVar34);
    auStack_10e8._0_8_ =
         (dVar34 - dVar38) * dVar43 -
         (((dVar33 - dVar30 * dVar38) - dVar38 * dVar43) - dVar30 * (dVar34 - dVar38));
    if (bVar16 != 0) {
      auStack_10e8._8_8_ = dVar33;
      dVar33 = -dVar51;
      dStack_1050 = dStack_1158 * dVar33;
      dVar35 = splitter * dVar33 - (dVar51 + splitter * dVar33);
      dVar34 = dStack_1158 * splitter - (dStack_1158 * splitter - dStack_1158);
      dVar43 = ((dStack_1050 - dVar35 * dVar34) - dVar34 * (dVar33 - dVar35)) -
               dVar35 * (dStack_1158 - dVar34);
      dStack_1058 = (dStack_1158 - dVar34) * (dVar33 - dVar35);
      goto LAB_0015efc2;
    }
    dVar38 = dVar29 * splitter - (dVar29 * splitter - dVar29);
    dVar34 = dVar29 - dVar38;
    dVar47 = dVar35 * splitter - (dVar35 * splitter - dVar35);
    dVar40 = (dVar35 - dVar47) * dVar34 -
             (((dStack_1138 - dVar38 * dVar47) - dVar47 * dVar34) - dVar38 * (dVar35 - dVar47));
    dVar50 = (double)auStack_10e8._0_8_ - dVar40;
    dVar47 = dVar33 + dVar50;
    dVar35 = (dVar33 - (dVar47 - (dVar47 - dVar33))) + (dVar50 - (dVar47 - dVar33));
    dVar33 = dVar35 - dStack_1138;
    dVar35 = (dVar35 - ((dVar35 - dVar33) + dVar33)) + ((dVar35 - dVar33) - dStack_1138);
    auStack_10e8._8_4_ = SUB84(dVar35,0);
    auStack_10e8._0_8_ =
         ((double)auStack_10e8._0_8_ - (dVar50 + ((double)auStack_10e8._0_8_ - dVar50))) +
         (((double)auStack_10e8._0_8_ - dVar50) - dVar40);
    auStack_10e8._12_4_ = (int)((ulong)dVar35 >> 0x20);
    dStack_10d0 = dVar47 + dVar33;
    dStack_10d8 = (dVar47 - (dStack_10d0 - (dStack_10d0 - dVar47))) +
                  (dVar33 - (dStack_10d0 - dVar47));
    dVar35 = splitter * dVar28 - (splitter * dVar28 - dVar28);
    dVar33 = splitter * dStack_11d0 - (splitter * dStack_11d0 - dStack_11d0);
    dVar47 = dVar29 * dVar28;
    dVar50 = dVar51 * dStack_11d0;
    dVar38 = dVar34 * (dVar28 - dVar35) -
             (-dVar38 * (dVar28 - dVar35) + -dVar34 * dVar35 + -dVar38 * dVar35 + dVar47);
    dVar43 = dVar43 * (dStack_11d0 - dVar33) -
             (-dVar30 * (dStack_11d0 - dVar33) + -dVar43 * dVar33 + -dVar30 * dVar33 + dVar50);
    dVar30 = dVar38 - dVar43;
    dVar35 = dVar47 + dVar30;
    dVar33 = (dVar47 - (dVar35 - (dVar35 - dVar47))) + (dVar30 - (dVar35 - dVar47));
    dVar34 = dVar33 - dVar50;
    dStack_1058 = (dVar38 - (dVar30 + (dVar38 - dVar30))) + ((dVar38 - dVar30) - dVar43);
    dStack_1050 = (dVar33 - (dVar34 + (dVar33 - dVar34))) + ((dVar33 - dVar34) - dVar50);
    dVar33 = dVar35 + dVar34;
    auStack_1048._8_4_ = SUB84(dVar33,0);
    auStack_1048._0_8_ = (dVar35 - (dVar33 - (dVar33 - dVar35))) + (dVar34 - (dVar33 - dVar35));
    auStack_1048._12_4_ = (int)((ulong)dVar33 >> 0x20);
    iVar18 = 4;
  }
  else if (bVar16 == 0) {
    dVar33 = -dVar29;
    dVar34 = splitter * dVar33 - (dVar29 + splitter * dVar33);
    dVar43 = dVar35 * splitter - (dVar35 * splitter - dVar35);
    auStack_10e8._8_8_ = dVar35 * dVar33;
    auStack_10e8._0_8_ =
         (dVar35 - dVar43) * (dVar33 - dVar34) -
         (((dVar35 * dVar33 - dVar34 * dVar43) - dVar43 * (dVar33 - dVar34)) -
         dVar34 * (dVar35 - dVar43));
    dStack_1050 = dVar28 * dVar29;
    dVar33 = dVar29 * splitter - (dVar29 * splitter - dVar29);
    dVar35 = splitter * dVar28 - (splitter * dVar28 - dVar28);
    dVar43 = ((dStack_1050 - dVar33 * dVar35) - dVar35 * (dVar29 - dVar33)) -
             dVar33 * (dVar28 - dVar35);
    dStack_1058 = (dVar28 - dVar35) * (dVar29 - dVar33);
LAB_0015efc2:
    dStack_1058 = dStack_1058 - dVar43;
    iVar18 = 2;
  }
  else {
    auVar14._8_8_ = 0;
    auVar14._0_8_ = auStack_10e8._8_8_;
    auStack_10e8 = auVar14 << 0x40;
    dStack_1058 = 0.0;
    iVar18 = 1;
  }
  if ((dVar39 != 0.0) || (NAN(dVar39))) {
    dVar33 = dVar39 * splitter - (dVar39 * splitter - dVar39);
    dVar35 = dVar39 - dVar33;
    dVar34 = dStack_1158 * splitter - (dStack_1158 * splitter - dStack_1158);
    dStack_1108 = (dStack_1158 - dVar34) * dVar35 -
                  (((dStack_1230 - dVar33 * dVar34) - dVar34 * dVar35) -
                  dVar33 * (dStack_1158 - dVar34));
    if ((dVar32 == 0.0) && (!NAN(dVar32))) {
      dStack_1100 = dStack_1230;
      dVar36 = -dVar39;
      auStack_1078._8_8_ = dVar37 * dVar36;
      dVar35 = splitter * dVar36 - (dVar39 + splitter * dVar36);
      dVar33 = dVar37 * splitter - (dVar37 * splitter - dVar37);
      auStack_1078._0_8_ =
           (dVar37 - dVar33) * (dVar36 - dVar35) -
           ((((double)auStack_1078._8_8_ - dVar35 * dVar33) - dVar33 * (dVar36 - dVar35)) -
           dVar35 * (dVar37 - dVar33));
      goto LAB_0015f505;
    }
    dVar30 = dVar32 * splitter - (dVar32 * splitter - dVar32);
    dVar38 = dVar32 - dVar30;
    dVar34 = dVar28 * splitter - (dVar28 * splitter - dVar28);
    dVar47 = (dVar28 - dVar34) * dVar38 -
             (((dStack_1130 - dVar30 * dVar34) - dVar34 * dVar38) - dVar30 * (dVar28 - dVar34));
    dVar50 = dStack_1108 - dVar47;
    dVar34 = dStack_1230 + dVar50;
    dVar43 = (dStack_1230 - (dVar34 - (dVar34 - dStack_1230))) + (dVar50 - (dVar34 - dStack_1230));
    dVar28 = dVar43 - dStack_1130;
    dStack_1108 = (dStack_1108 - (dVar50 + (dStack_1108 - dVar50))) +
                  ((dStack_1108 - dVar50) - dVar47);
    dStack_1100 = (dVar43 - ((dVar43 - dVar28) + dVar28)) + ((dVar43 - dVar28) - dStack_1130);
    dStack_10f0 = dVar34 + dVar28;
    dStack_10f8 = (dVar34 - (dStack_10f0 - (dStack_10f0 - dVar34))) +
                  (dVar28 - (dStack_10f0 - dVar34));
    dVar34 = splitter * dVar36 - (splitter * dVar36 - dVar36);
    dVar43 = splitter * dVar37 - (splitter * dVar37 - dVar37);
    dVar28 = dVar32 * dVar36;
    dVar47 = dVar39 * dVar37;
    dVar36 = dVar38 * (dVar36 - dVar34) -
             (-dVar30 * (dVar36 - dVar34) + -dVar38 * dVar34 + -dVar30 * dVar34 + dVar28);
    dVar33 = dVar35 * (dVar37 - dVar43) -
             (-dVar33 * (dVar37 - dVar43) + -dVar35 * dVar43 + -dVar33 * dVar43 + dVar47);
    dVar34 = dVar36 - dVar33;
    dVar35 = dVar28 + dVar34;
    dVar43 = (dVar28 - (dVar35 - (dVar35 - dVar28))) + (dVar34 - (dVar35 - dVar28));
    dVar38 = dVar43 - dVar47;
    dVar43 = (dVar43 - (dVar38 + (dVar43 - dVar38))) + ((dVar43 - dVar38) - dVar47);
    auStack_1078._8_4_ = SUB84(dVar43,0);
    auStack_1078._0_8_ = (dVar36 - (dVar34 + (dVar36 - dVar34))) + ((dVar36 - dVar34) - dVar33);
    auStack_1078._12_4_ = (int)((ulong)dVar43 >> 0x20);
    dVar33 = dVar35 + dVar38;
    auStack_1068._8_4_ = SUB84(dVar33,0);
    auStack_1068._0_8_ = (dVar35 - (dVar33 - (dVar33 - dVar35))) + (dVar38 - (dVar33 - dVar35));
    auStack_1068._12_4_ = (int)((ulong)dVar33 >> 0x20);
    iVar19 = 4;
  }
  else if ((dVar32 != 0.0) || (NAN(dVar32))) {
    dVar34 = -dVar32;
    dStack_1100 = dVar28 * dVar34;
    dVar35 = splitter * dVar34 - (dVar32 + splitter * dVar34);
    dVar33 = dVar28 * splitter - (dVar28 * splitter - dVar28);
    dStack_1108 = (dVar28 - dVar33) * (dVar34 - dVar35) -
                  (((dStack_1100 - dVar35 * dVar33) - dVar33 * (dVar34 - dVar35)) -
                  dVar35 * (dVar28 - dVar33));
    auStack_1078._8_8_ = dVar36 * dVar32;
    dVar33 = dVar32 * splitter - (dVar32 * splitter - dVar32);
    dVar35 = splitter * dVar36 - (splitter * dVar36 - dVar36);
    auStack_1078._0_8_ =
         (dVar36 - dVar35) * (dVar32 - dVar33) -
         ((((double)auStack_1078._8_8_ - dVar33 * dVar35) - dVar35 * (dVar32 - dVar33)) -
         dVar33 * (dVar36 - dVar35));
LAB_0015f505:
    iVar19 = 2;
  }
  else {
    dStack_1108 = 0.0;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = auStack_1078._8_8_;
    auStack_1078 = auVar15 << 0x40;
    iVar19 = 1;
  }
  iVar21 = fast_expansion_sum_zeroelim
                     (iVar18,(double *)auStack_10e8,iVar19,(double *)auStack_1078,adStack_db8);
  iVar22 = scale_expansion_zeroelim(iVar21,adStack_db8,dVar31,adStack_f18);
  pdVar24 = adStack_638;
  iVar22 = fast_expansion_sum_zeroelim(uVar20,pdVar25,iVar22,adStack_f18,pdVar24);
  iVar19 = fast_expansion_sum_zeroelim
                     (iVar19,&dStack_1108,iVar17,(double *)auStack_1038,adStack_df8);
  flen = scale_expansion_zeroelim(iVar19,adStack_df8,(double)auStack_10a8._0_8_,adStack_f18);
  iVar22 = fast_expansion_sum_zeroelim(iVar22,pdVar24,flen,adStack_f18,pdVar25);
  iVar17 = fast_expansion_sum_zeroelim(iVar17,&dStack_10c8,iVar18,&dStack_1058,adStack_e38);
  iVar18 = scale_expansion_zeroelim(iVar17,adStack_e38,dVar10,adStack_f18);
  iVar18 = fast_expansion_sum_zeroelim(iVar22,pdVar25,iVar18,adStack_f18,pdVar24);
  if ((dVar48 != 0.0) || (NAN(dVar48))) {
    iVar22 = scale_expansion_zeroelim(4,(double *)auStack_f38,dVar48,adStack_e98);
    pdVar25 = adStack_638;
    pdVar24 = adStack_c38;
    iVar18 = fast_expansion_sum_zeroelim(iVar18,pdVar25,iVar22,adStack_e98,pdVar24);
  }
  if ((dVar49 != 0.0) || (pdVar26 = pdVar24, NAN(dVar49))) {
    iVar22 = scale_expansion_zeroelim(4,(double *)auStack_f58,dVar49,adStack_e98);
    iVar18 = fast_expansion_sum_zeroelim(iVar18,pdVar24,iVar22,adStack_e98,pdVar25);
    pdVar26 = pdVar25;
    pdVar25 = pdVar24;
  }
  if ((dVar52 != 0.0) || (pdVar24 = pdVar26, NAN(dVar52))) {
    iVar22 = scale_expansion_zeroelim(4,(double *)auStack_f78,dVar52,adStack_e98);
    iVar18 = fast_expansion_sum_zeroelim(iVar18,pdVar26,iVar22,adStack_e98,pdVar25);
    pdVar24 = pdVar25;
    pdVar25 = pdVar26;
  }
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    if ((dVar29 != 0.0) || (pdVar26 = pdVar25, pdVar27 = pdVar24, NAN(dVar29))) {
      dVar30 = dVar1 * dVar29;
      dVar33 = dVar1 * splitter - (dVar1 * splitter - dVar1);
      dVar35 = dVar29 * splitter - (dVar29 * splitter - dVar29);
      dVar38 = (dVar29 - dVar35) * (dVar1 - dVar33) -
               (((dVar30 - dVar33 * dVar35) - dVar35 * (dVar1 - dVar33)) -
               dVar33 * (dVar29 - dVar35));
      dVar43 = dVar10 * splitter - (dVar10 * splitter - dVar10);
      dVar33 = dVar10 - dVar43;
      dVar34 = dVar10 * dVar38;
      dVar35 = splitter * dVar38 - (splitter * dVar38 - dVar38);
      dStack_1178 = (dVar38 - dVar35) * dVar33 -
                    (((dVar34 - dVar35 * dVar43) - (dVar38 - dVar35) * dVar43) - dVar35 * dVar33);
      dVar36 = dVar30 * dVar10;
      dVar35 = splitter * dVar30 - (splitter * dVar30 - dVar30);
      dVar35 = (dVar30 - dVar35) * dVar33 -
               (((dVar36 - dVar35 * dVar43) - dVar43 * (dVar30 - dVar35)) - dVar35 * dVar33);
      dStack_1168 = dVar35 + dVar34;
      dStack_1170 = (dVar34 - (dStack_1168 - (dStack_1168 - dVar34))) +
                    (dVar35 - (dStack_1168 - dVar34));
      dStack_1160 = dVar36 + dStack_1168;
      dStack_1168 = dStack_1168 - (dStack_1160 - dVar36);
      iVar18 = fast_expansion_sum_zeroelim(iVar18,pdVar24,4,&dStack_1178,pdVar25);
      if ((dVar52 != 0.0) || (pdVar26 = pdVar24, pdVar27 = pdVar25, NAN(dVar52))) {
        dVar43 = dVar52 * splitter - (dVar52 * splitter - dVar52);
        dVar33 = dVar52 - dVar43;
        dVar35 = dVar52 * dVar38;
        dVar36 = dVar38 * splitter - (dVar38 * splitter - dVar38);
        dStack_1178 = (dVar38 - dVar36) * dVar33 -
                      (((dVar35 - dVar36 * dVar43) - (dVar38 - dVar36) * dVar43) - dVar36 * dVar33);
        dVar36 = dVar30 * dVar52;
        dVar34 = splitter * dVar30 - (splitter * dVar30 - dVar30);
        dVar33 = (dVar30 - dVar34) * dVar33 -
                 (((dVar36 - dVar34 * dVar43) - dVar43 * (dVar30 - dVar34)) - dVar34 * dVar33);
        dStack_1168 = dVar35 + dVar33;
        dStack_1170 = (dVar35 - (dStack_1168 - (dStack_1168 - dVar35))) +
                      (dVar33 - (dStack_1168 - dVar35));
        dStack_1160 = dVar36 + dStack_1168;
        dStack_1168 = dStack_1168 - (dStack_1160 - dVar36);
        iVar18 = fast_expansion_sum_zeroelim(iVar18,pdVar25,4,&dStack_1178,pdVar24);
        pdVar26 = pdVar25;
        pdVar27 = pdVar24;
      }
    }
    if ((dVar32 != 0.0) || (pdVar24 = pdVar27, pdVar25 = pdVar26, NAN(dVar32))) {
      dVar35 = -dVar1;
      dVar43 = dVar32 * dVar35;
      dVar33 = splitter * dVar35 - (dVar1 + splitter * dVar35);
      dVar1 = dVar32 * splitter - (dVar32 * splitter - dVar32);
      dVar38 = (dVar32 - dVar1) * (dVar35 - dVar33) -
               (((dVar43 - dVar33 * dVar1) - dVar1 * (dVar35 - dVar33)) - dVar33 * (dVar32 - dVar1))
      ;
      dVar34 = (double)auStack_10a8._0_8_ * splitter -
               ((double)auStack_10a8._0_8_ * splitter - (double)auStack_10a8._0_8_);
      dVar35 = (double)auStack_10a8._0_8_ - dVar34;
      dVar36 = (double)auStack_10a8._0_8_ * dVar38;
      dVar1 = splitter * dVar38 - (splitter * dVar38 - dVar38);
      dStack_1178 = (dVar38 - dVar1) * dVar35 -
                    (((dVar36 - dVar1 * dVar34) - (dVar38 - dVar1) * dVar34) - dVar1 * dVar35);
      dVar33 = (double)auStack_10a8._0_8_ * dVar43;
      dVar1 = splitter * dVar43 - (splitter * dVar43 - dVar43);
      dVar1 = (dVar43 - dVar1) * dVar35 -
              (((dVar33 - dVar1 * dVar34) - dVar34 * (dVar43 - dVar1)) - dVar1 * dVar35);
      dStack_1168 = dVar1 + dVar36;
      dStack_1170 = (dVar36 - (dStack_1168 - (dStack_1168 - dVar36))) +
                    (dVar1 - (dStack_1168 - dVar36));
      dStack_1160 = dVar33 + dStack_1168;
      dStack_1168 = dStack_1168 - (dStack_1160 - dVar33);
      iVar18 = fast_expansion_sum_zeroelim(iVar18,pdVar27,4,&dStack_1178,pdVar26);
      if ((dVar49 != 0.0) || (pdVar24 = pdVar26, pdVar25 = pdVar27, NAN(dVar49))) {
        dVar34 = dVar49 * splitter - (dVar49 * splitter - dVar49);
        dVar35 = dVar49 - dVar34;
        dVar1 = dVar49 * dVar38;
        dVar33 = dVar38 * splitter - (dVar38 * splitter - dVar38);
        dStack_1178 = (dVar38 - dVar33) * dVar35 -
                      (((dVar1 - dVar33 * dVar34) - (dVar38 - dVar33) * dVar34) - dVar33 * dVar35);
        dVar33 = dVar43 * dVar49;
        dVar36 = splitter * dVar43 - (splitter * dVar43 - dVar43);
        dVar35 = (dVar43 - dVar36) * dVar35 -
                 (((dVar33 - dVar36 * dVar34) - dVar34 * (dVar43 - dVar36)) - dVar36 * dVar35);
        dStack_1168 = dVar1 + dVar35;
        dStack_1170 = (dVar1 - (dStack_1168 - (dStack_1168 - dVar1))) +
                      (dVar35 - (dStack_1168 - dVar1));
        dStack_1160 = dVar33 + dStack_1168;
        dStack_1168 = dStack_1168 - (dStack_1160 - dVar33);
        iVar18 = fast_expansion_sum_zeroelim(iVar18,pdVar26,4,&dStack_1178,pdVar27);
        pdVar24 = pdVar27;
        pdVar25 = pdVar26;
      }
    }
  }
  if ((dVar51 != 0.0) || (NAN(dVar51))) {
    if ((dVar32 != 0.0) || (pdVar26 = pdVar25, pdVar27 = pdVar24, NAN(dVar32))) {
      dVar43 = dVar51 * dVar32;
      dVar35 = dVar51 * splitter - (dVar51 * splitter - dVar51);
      dVar1 = dVar32 * splitter - (dVar32 * splitter - dVar32);
      dVar32 = (dVar32 - dVar1) * (dVar51 - dVar35) -
               (((dVar43 - dVar35 * dVar1) - dVar1 * (dVar51 - dVar35)) - dVar35 * (dVar32 - dVar1))
      ;
      dVar34 = dVar31 * splitter - (dVar31 * splitter - dVar31);
      dVar35 = dVar31 - dVar34;
      dVar36 = dVar31 * dVar32;
      dVar1 = splitter * dVar32 - (splitter * dVar32 - dVar32);
      dStack_1178 = (dVar32 - dVar1) * dVar35 -
                    (((dVar36 - dVar1 * dVar34) - (dVar32 - dVar1) * dVar34) - dVar1 * dVar35);
      dVar33 = dVar31 * dVar43;
      dVar1 = splitter * dVar43 - (splitter * dVar43 - dVar43);
      dVar1 = (dVar43 - dVar1) * dVar35 -
              (((dVar33 - dVar1 * dVar34) - dVar34 * (dVar43 - dVar1)) - dVar1 * dVar35);
      dStack_1168 = dVar1 + dVar36;
      dStack_1170 = (dVar36 - (dStack_1168 - (dStack_1168 - dVar36))) +
                    (dVar1 - (dStack_1168 - dVar36));
      dStack_1160 = dVar33 + dStack_1168;
      dStack_1168 = dStack_1168 - (dStack_1160 - dVar33);
      iVar18 = fast_expansion_sum_zeroelim(iVar18,pdVar24,4,&dStack_1178,pdVar25);
      if ((dVar48 != 0.0) || (pdVar26 = pdVar24, pdVar27 = pdVar25, NAN(dVar48))) {
        dVar34 = dVar48 * splitter - (dVar48 * splitter - dVar48);
        dVar35 = dVar48 - dVar34;
        dVar1 = dVar48 * dVar32;
        dVar33 = dVar32 * splitter - (dVar32 * splitter - dVar32);
        dStack_1178 = (dVar32 - dVar33) * dVar35 -
                      (((dVar1 - dVar33 * dVar34) - (dVar32 - dVar33) * dVar34) - dVar33 * dVar35);
        dVar33 = dVar48 * dVar43;
        dVar36 = splitter * dVar43 - (splitter * dVar43 - dVar43);
        dVar35 = (dVar43 - dVar36) * dVar35 -
                 (((dVar33 - dVar36 * dVar34) - dVar34 * (dVar43 - dVar36)) - dVar36 * dVar35);
        dStack_1168 = dVar1 + dVar35;
        dStack_1170 = (dVar1 - (dStack_1168 - (dStack_1168 - dVar1))) +
                      (dVar35 - (dStack_1168 - dVar1));
        dStack_1160 = dVar33 + dStack_1168;
        dStack_1168 = dStack_1168 - (dStack_1160 - dVar33);
        iVar18 = fast_expansion_sum_zeroelim(iVar18,pdVar25,4,&dStack_1178,pdVar24);
        pdVar26 = pdVar25;
        pdVar27 = pdVar24;
      }
    }
    if ((dVar44 != 0.0) || (pdVar24 = pdVar27, pdVar25 = pdVar26, NAN(dVar44))) {
      dVar35 = -dVar51;
      dVar34 = dVar44 * dVar35;
      dVar33 = splitter * dVar35 - (dVar51 + splitter * dVar35);
      dVar1 = dVar44 * splitter - (dVar44 * splitter - dVar44);
      dVar33 = (dVar44 - dVar1) * (dVar35 - dVar33) -
               (((dVar34 - dVar33 * dVar1) - dVar1 * (dVar35 - dVar33)) - dVar33 * (dVar44 - dVar1))
      ;
      dVar51 = dVar10 * splitter - (dVar10 * splitter - dVar10);
      dVar35 = dVar10 - dVar51;
      dVar36 = dVar10 * dVar33;
      dVar1 = splitter * dVar33 - (splitter * dVar33 - dVar33);
      dStack_1178 = (dVar33 - dVar1) * dVar35 -
                    (((dVar36 - dVar1 * dVar51) - (dVar33 - dVar1) * dVar51) - dVar1 * dVar35);
      dVar10 = dVar10 * dVar34;
      dVar1 = splitter * dVar34 - (splitter * dVar34 - dVar34);
      dVar1 = (dVar34 - dVar1) * dVar35 -
              (((dVar10 - dVar1 * dVar51) - dVar51 * (dVar34 - dVar1)) - dVar1 * dVar35);
      dStack_1168 = dVar1 + dVar36;
      dStack_1170 = (dVar36 - (dStack_1168 - (dStack_1168 - dVar36))) +
                    (dVar1 - (dStack_1168 - dVar36));
      dStack_1160 = dVar10 + dStack_1168;
      dStack_1168 = dStack_1168 - (dStack_1160 - dVar10);
      iVar18 = fast_expansion_sum_zeroelim(iVar18,pdVar27,4,&dStack_1178,pdVar26);
      if ((dVar52 != 0.0) || (pdVar24 = pdVar26, pdVar25 = pdVar27, NAN(dVar52))) {
        dVar51 = dVar52 * splitter - (dVar52 * splitter - dVar52);
        dVar35 = dVar52 - dVar51;
        dVar1 = dVar52 * dVar33;
        dVar36 = dVar33 * splitter - (dVar33 * splitter - dVar33);
        dStack_1178 = (dVar33 - dVar36) * dVar35 -
                      (((dVar1 - dVar36 * dVar51) - (dVar33 - dVar36) * dVar51) - dVar36 * dVar35);
        dVar33 = dVar34 * dVar52;
        dVar36 = splitter * dVar34 - (splitter * dVar34 - dVar34);
        dVar35 = (dVar34 - dVar36) * dVar35 -
                 (((dVar33 - dVar36 * dVar51) - dVar51 * (dVar34 - dVar36)) - dVar36 * dVar35);
        dStack_1168 = dVar1 + dVar35;
        dStack_1170 = (dVar1 - (dStack_1168 - (dStack_1168 - dVar1))) +
                      (dVar35 - (dStack_1168 - dVar1));
        dStack_1160 = dVar33 + dStack_1168;
        dStack_1168 = dStack_1168 - (dStack_1160 - dVar33);
        iVar18 = fast_expansion_sum_zeroelim(iVar18,pdVar26,4,&dStack_1178,pdVar27);
        pdVar24 = pdVar27;
        pdVar25 = pdVar26;
      }
    }
  }
  pdVar26 = pdVar25;
  if ((dVar39 != 0.0) || (NAN(dVar39))) {
    if ((dVar44 != 0.0) || (pdVar27 = pdVar24, NAN(dVar44))) {
      dVar32 = dVar39 * dVar44;
      dVar35 = dVar39 * splitter - (dVar39 * splitter - dVar39);
      dVar1 = dVar44 * splitter - (dVar44 * splitter - dVar44);
      dVar33 = (dVar44 - dVar1) * (dVar39 - dVar35) -
               (((dVar32 - dVar35 * dVar1) - dVar1 * (dVar39 - dVar35)) - dVar35 * (dVar44 - dVar1))
      ;
      dVar34 = (double)auStack_10a8._0_8_ * splitter -
               ((double)auStack_10a8._0_8_ * splitter - (double)auStack_10a8._0_8_);
      dVar35 = (double)auStack_10a8._0_8_ - dVar34;
      dVar51 = (double)auStack_10a8._0_8_ * dVar33;
      dVar1 = splitter * dVar33 - (splitter * dVar33 - dVar33);
      dStack_1178 = (dVar33 - dVar1) * dVar35 -
                    (((dVar51 - dVar1 * dVar34) - (dVar33 - dVar1) * dVar34) - dVar1 * dVar35);
      dVar36 = (double)auStack_10a8._0_8_ * dVar32;
      dVar1 = splitter * dVar32 - (splitter * dVar32 - dVar32);
      dVar1 = (dVar32 - dVar1) * dVar35 -
              (((dVar36 - dVar1 * dVar34) - dVar34 * (dVar32 - dVar1)) - dVar1 * dVar35);
      dStack_1168 = dVar1 + dVar51;
      dStack_1170 = (dVar51 - (dStack_1168 - (dStack_1168 - dVar51))) +
                    (dVar1 - (dStack_1168 - dVar51));
      dStack_1160 = dVar36 + dStack_1168;
      dStack_1168 = dStack_1168 - (dStack_1160 - dVar36);
      iVar18 = fast_expansion_sum_zeroelim(iVar18,pdVar24,4,&dStack_1178,pdVar25);
      if ((dVar49 != 0.0) || (pdVar26 = pdVar24, pdVar27 = pdVar25, NAN(dVar49))) {
        dVar51 = dVar49 * splitter - (dVar49 * splitter - dVar49);
        dVar35 = dVar49 - dVar51;
        dVar1 = dVar49 * dVar33;
        dVar36 = dVar33 * splitter - (dVar33 * splitter - dVar33);
        dStack_1178 = (dVar33 - dVar36) * dVar35 -
                      (((dVar1 - dVar36 * dVar51) - (dVar33 - dVar36) * dVar51) - dVar36 * dVar35);
        dVar33 = dVar32 * dVar49;
        dVar36 = splitter * dVar32 - (splitter * dVar32 - dVar32);
        dVar35 = (dVar32 - dVar36) * dVar35 -
                 (((dVar33 - dVar36 * dVar51) - dVar51 * (dVar32 - dVar36)) - dVar36 * dVar35);
        dStack_1168 = dVar1 + dVar35;
        dStack_1170 = (dVar1 - (dStack_1168 - (dStack_1168 - dVar1))) +
                      (dVar35 - (dStack_1168 - dVar1));
        dStack_1160 = dVar33 + dStack_1168;
        dStack_1168 = dStack_1168 - (dStack_1160 - dVar33);
        iVar18 = fast_expansion_sum_zeroelim(iVar18,pdVar25,4,&dStack_1178,pdVar24);
        pdVar26 = pdVar25;
        pdVar27 = pdVar24;
      }
    }
    pdVar24 = pdVar27;
    if ((dVar29 == 0.0) && (!NAN(dVar29))) goto LAB_00160dc6;
    dVar35 = -dVar39;
    dVar51 = dVar29 * dVar35;
    dVar33 = splitter * dVar35 - (dVar39 + splitter * dVar35);
    dVar1 = dVar29 * splitter - (dVar29 * splitter - dVar29);
    dVar36 = (dVar29 - dVar1) * (dVar35 - dVar33) -
             (((dVar51 - dVar33 * dVar1) - dVar1 * (dVar35 - dVar33)) - dVar33 * (dVar29 - dVar1));
    dVar33 = dVar31 * splitter - (dVar31 * splitter - dVar31);
    dVar35 = dVar31 - dVar33;
    dVar29 = dVar31 * dVar36;
    dVar1 = splitter * dVar36 - (splitter * dVar36 - dVar36);
    dStack_1178 = (dVar36 - dVar1) * dVar35 -
                  (((dVar29 - dVar1 * dVar33) - (dVar36 - dVar1) * dVar33) - dVar1 * dVar35);
    dVar31 = dVar31 * dVar51;
    dVar1 = splitter * dVar51 - (splitter * dVar51 - dVar51);
    dVar1 = (dVar51 - dVar1) * dVar35 -
            (((dVar31 - dVar1 * dVar33) - dVar33 * (dVar51 - dVar1)) - dVar1 * dVar35);
    dStack_1168 = dVar1 + dVar29;
    dStack_1170 = (dVar29 - (dStack_1168 - (dStack_1168 - dVar29))) +
                  (dVar1 - (dStack_1168 - dVar29));
    dStack_1160 = dVar31 + dStack_1168;
    dStack_1168 = dStack_1168 - (dStack_1160 - dVar31);
    iVar18 = fast_expansion_sum_zeroelim(iVar18,pdVar27,4,&dStack_1178,pdVar26);
    if ((dVar48 == 0.0) && (pdVar25 = pdVar26, !NAN(dVar48))) goto LAB_00160e09;
    dVar34 = dVar48 * splitter - (dVar48 * splitter - dVar48);
    dVar35 = dVar48 - dVar34;
    dVar1 = dVar48 * dVar36;
    dVar29 = dVar36 * splitter - (dVar36 * splitter - dVar36);
    dStack_1178 = (dVar36 - dVar29) * dVar35 -
                  (((dVar1 - dVar29 * dVar34) - (dVar36 - dVar29) * dVar34) - dVar29 * dVar35);
    dVar29 = dVar51 * dVar48;
    dVar33 = splitter * dVar51 - (splitter * dVar51 - dVar51);
    dVar35 = (dVar51 - dVar33) * dVar35 -
             (((dVar29 - dVar33 * dVar34) - dVar34 * (dVar51 - dVar33)) - dVar33 * dVar35);
    dStack_1168 = dVar1 + dVar35;
    dStack_1170 = (dVar1 - (dStack_1168 - (dStack_1168 - dVar1))) + (dVar35 - (dStack_1168 - dVar1))
    ;
    dStack_1160 = dVar29 + dStack_1168;
    dStack_1168 = dStack_1168 - (dStack_1160 - dVar29);
    iVar18 = fast_expansion_sum_zeroelim(iVar18,pdVar26,4,&dStack_1178,pdVar27);
  }
  else {
LAB_00160dc6:
    if ((dVar48 == 0.0) && (pdVar25 = pdVar24, pdVar27 = pdVar26, !NAN(dVar48))) goto LAB_00160e09;
  }
  iVar21 = scale_expansion_zeroelim(iVar21,adStack_db8,dVar48,adStack_f18);
  iVar18 = fast_expansion_sum_zeroelim(iVar18,pdVar24,iVar21,adStack_f18,pdVar26);
  pdVar25 = pdVar26;
  pdVar27 = pdVar24;
LAB_00160e09:
  if ((dVar49 != 0.0) || (pdVar24 = pdVar27, NAN(dVar49))) {
    iVar19 = scale_expansion_zeroelim(iVar19,adStack_df8,dVar49,adStack_f18);
    iVar18 = fast_expansion_sum_zeroelim(iVar18,pdVar25,iVar19,adStack_f18,pdVar27);
    pdVar24 = pdVar25;
    pdVar25 = pdVar27;
  }
  if ((dVar52 != 0.0) || (NAN(dVar52))) {
    iVar17 = scale_expansion_zeroelim(iVar17,adStack_e38,dVar52,adStack_f18);
    iVar18 = fast_expansion_sum_zeroelim(iVar18,pdVar25,iVar17,adStack_f18,pdVar24);
    pdVar25 = pdVar24;
  }
  return pdVar25[(long)iVar18 + -1];
}

Assistant:

REAL orient3d(REAL *pa, REAL *pb, REAL *pc, REAL *pd)
{
  REAL adx, bdx, cdx, ady, bdy, cdy, adz, bdz, cdz;
  REAL bdxcdy, cdxbdy, cdxady, adxcdy, adxbdy, bdxady;
  REAL det;


  adx = pa[0] - pd[0];
  ady = pa[1] - pd[1];
  adz = pa[2] - pd[2];
  bdx = pb[0] - pd[0];
  bdy = pb[1] - pd[1];
  bdz = pb[2] - pd[2];
  cdx = pc[0] - pd[0];
  cdy = pc[1] - pd[1];
  cdz = pc[2] - pd[2];

  bdxcdy = bdx * cdy;
  cdxbdy = cdx * bdy;

  cdxady = cdx * ady;
  adxcdy = adx * cdy;

  adxbdy = adx * bdy;
  bdxady = bdx * ady;

  det = adz * (bdxcdy - cdxbdy) 
      + bdz * (cdxady - adxcdy)
      + cdz * (adxbdy - bdxady);

  if (_use_inexact_arith) {
    return det;
  }

  if (_use_static_filter) {
    //if (fabs(det) > o3dstaticfilter) return det;
    if (det > o3dstaticfilter) return det;
    if (det < -o3dstaticfilter) return det;
  }


  REAL permanent, errbound;

  permanent = (Absolute(bdxcdy) + Absolute(cdxbdy)) * Absolute(adz)
            + (Absolute(cdxady) + Absolute(adxcdy)) * Absolute(bdz)
            + (Absolute(adxbdy) + Absolute(bdxady)) * Absolute(cdz);
  errbound = o3derrboundA * permanent;
  if ((det > errbound) || (-det > errbound)) {
    return det;
  }

  return orient3dadapt(pa, pb, pc, pd, permanent);
}